

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageDivide(StackInterpreter *this)

{
  bool bVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar2;
  SmallIntegerValue SVar3;
  SmallIntegerValue SVar4;
  Oop object;
  double dVar5;
  double dVar6;
  double fb;
  double fa;
  SmallIntegerValue ib;
  SmallIntegerValue ia;
  Oop b;
  Oop a;
  StackInterpreter *this_local;
  
  paVar2 = &stackOopAt(this,1)->field_0;
  b.field_0 = *paVar2;
  paVar2 = &stackOopAt(this,0)->field_0;
  ia = paVar2->intValue;
  bVar1 = Oop::isSmallInteger(&b);
  if ((bVar1) && (bVar1 = Oop::isSmallInteger((Oop *)&ia), bVar1)) {
    SVar3 = Oop::decodeSmallInteger(&b);
    SVar4 = Oop::decodeSmallInteger((Oop *)&ia);
    if (SVar3 % SVar4 == 0) {
      popMultiplesOops(this,2);
      fetchNextInstructionOpcode(this);
      object = Oop::encodeSmallInteger(SVar3 / SVar4);
      pushOop(this,object);
    }
    else {
      sendSpecialArgumentCount(this,Divide,1);
    }
  }
  else {
    bVar1 = Oop::isFloatOrInt(&b);
    if ((bVar1) && (bVar1 = Oop::isFloatOrInt((Oop *)&ia), bVar1)) {
      fetchNextInstructionOpcode(this);
      popMultiplesOops(this,2);
      dVar5 = Oop::decodeFloatOrInt(&b);
      dVar6 = Oop::decodeFloatOrInt((Oop *)&ia);
      pushFloatObject(this,dVar5 / dVar6);
    }
    else {
      sendSpecialArgumentCount(this,Divide,1);
    }
  }
  return;
}

Assistant:

void interpretSpecialMessageDivide()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            if(ia % ib == 0)
            {
                popMultiplesOops(2);
                fetchNextInstructionOpcode();

                pushOop(Oop::encodeSmallInteger(ia / ib));
            }
            else
            {
                // Allow the image side to make a fraction.
                sendSpecialArgumentCount(SpecialMessageSelector::Divide, 1);
            }
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushFloatObject(fa / fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::Divide, 1);
        }
    }